

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Write.cpp
# Opt level: O2

error<idx2::idx2_err_code> idx2::FlushChunkExponents(idx2_file *Idx2,encode_data *E)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  sub_channel_info *Beg;
  ulong *puVar8;
  undefined1 auVar9 [16];
  long lVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  size_t sVar15;
  long lVar16;
  i8 in_R9B;
  int Var;
  size_t __size;
  byte *pbVar17;
  long *in_FS_OFFSET;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 in_ZMM2 [64];
  undefined8 in_XMM4_Qb;
  stref sVar22;
  FILE *Fp;
  ulong *local_b8;
  long *local_b0;
  long *local_a8;
  long local_a0;
  idx2_file *local_98;
  anon_union_8_2_2df48d06_for_stref_0 local_90;
  long local_88;
  long local_80;
  bitstream *local_78;
  hash_table<unsigned_long,_idx2::chunk_exp_info> *local_70;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2Write_cpp:173:5)>
  __ScopeGuard__173;
  anon_union_8_2_2df48d06_for_stref_0 local_58;
  undefined4 local_50;
  file_id FileId;
  
  local_98 = Idx2;
  GrowCapacity<idx2::sub_channel_info>(&E->SortedSubChannels,(E->SubChannels).Size);
  (E->SortedSubChannels).Size = 0;
  Begin<unsigned_long,idx2::sub_channel>(&E->SubChannels);
  while ((plVar11 = local_b0,
         (hash_table<unsigned_long,_idx2::sub_channel> *)local_a8 != &E->SubChannels ||
         (local_a0 != 1L << ((byte)(E->SubChannels).LogCapacity & 0x3f)))) {
    uVar7 = *local_b8;
    lVar13 = (E->SortedSubChannels).Size;
    if ((E->SortedSubChannels).Capacity <= lVar13) {
      GrowCapacity<idx2::sub_channel_info>(&E->SortedSubChannels,0);
      lVar13 = (E->SortedSubChannels).Size;
    }
    (E->SortedSubChannels).Size = lVar13 + 1;
    pbVar14 = (E->SortedSubChannels).Buffer.Data;
    lVar13 = lVar13 * 0x10;
    pbVar14[lVar13] = (byte)(uVar7 >> 0x3c);
    pbVar14[lVar13 + 1] = (byte)(uVar7 >> 0xc) & 0x3f;
    *(long **)(pbVar14 + lVar13 + 8) = plVar11;
    lVar13 = local_a0 * 8;
    lVar12 = local_a0 * 0x70;
    do {
      lVar16 = lVar12;
      lVar13 = lVar13 + 8;
      lVar10 = local_a0 + 1;
      local_a0 = local_a0 + 1;
      lVar12 = lVar16 + 0x70;
    } while (*(char *)(local_a8[2] + lVar10) != '\x02');
    local_b8 = (ulong *)(lVar13 + *local_a8);
    local_b0 = (long *)(local_a8[1] + 0x70 + lVar16);
  }
  Beg = (sub_channel_info *)(E->SortedSubChannels).Buffer.Data;
  InsertionSort<idx2::sub_channel_info*>(Beg,Beg + (E->SortedSubChannels).Size);
  pbVar14 = (E->SortedSubChannels).Buffer.Data;
  for (pbVar17 = pbVar14; pbVar17 != pbVar14 + (E->SortedSubChannels).Size * 0x10;
      pbVar17 = pbVar17 + 0x10) {
    WriteChunkExponents((idx2 *)local_98,(idx2_file *)E,*(encode_data **)(pbVar17 + 8),
                        (sub_channel *)(ulong)(uint)(int)(char)*pbVar17,pbVar17[1],in_R9B);
    pbVar14 = (E->SortedSubChannels).Buffer.Data;
  }
  local_70 = &E->ChunkExponents;
  Begin<unsigned_long,idx2::chunk_exp_info>(local_70);
  local_78 = &E->CompressedChunkAddresses;
  while( true ) {
    plVar11 = local_b0;
    uVar21 = in_ZMM2._8_8_;
    if (((hash_table<unsigned_long,_idx2::chunk_exp_info> *)local_a8 == local_70) &&
       (local_a0 == 1L << ((byte)(E->ChunkExponents).LogCapacity & 0x3f))) break;
    ConstructFilePath(&FileId,local_98,*local_b8);
    Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"ab");
    __ScopeGuard__173.Func.Fp = &Fp;
    __ScopeGuard__173.Dismissed = false;
    if ((FILE *)Fp == (FILE *)0x0) {
      local_58 = FileId.Name.field_0;
      sVar15 = strlen(FileId.Name.field_0.Ptr);
      local_50 = (undefined4)sVar15;
      sVar22 = GetParentPath((stref *)&local_58);
      local_90 = sVar22.field_0;
      local_88 = CONCAT44(local_88._4_4_,sVar22.Size);
      CreateFullDir((stref *)&local_90);
      Fp = (FILE *)fopen(FileId.Name.field_0.Ptr,"ab");
    }
    puVar8 = (ulong *)plVar11[3];
    uVar7 = plVar11[4];
    *puVar8 = uVar7;
    uVar6 = *(uint *)(plVar11 + 5);
    if (0 < (int)uVar6 >> 3) {
      plVar11[4] = (uVar7 >> 1) >> (((byte)uVar6 & 0xf8) - 1 & 0x3f);
    }
    lVar13 = (long)puVar8 + (long)((int)uVar6 >> 3);
    plVar11[3] = lVar13;
    *(uint *)(plVar11 + 5) = uVar6 & 7;
    auVar18._0_8_ = (double)(long)(((ulong)((uVar6 & 7) != 0) + lVar13) - *plVar11);
    auVar18._8_8_ = uVar21;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_0;
    auVar9 = vminsd_avx(auVar18,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = _ZN4idx2L17ExpChunkSizesStatE_1;
    auVar1 = vmaxsd_avx(auVar18,auVar2);
    in_ZMM2 = ZEXT1664(auVar1);
    _ZN4idx2L17ExpChunkSizesStatE_2 = auVar18._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_2;
    _ZN4idx2L17ExpChunkSizesStatE_0 = auVar9._0_8_;
    _ZN4idx2L17ExpChunkSizesStatE_3 = _ZN4idx2L17ExpChunkSizesStatE_3 + 1;
    _ZN4idx2L17ExpChunkSizesStatE_1 = auVar1._0_8_;
    _ZN4idx2L17ExpChunkSizesStatE_4 =
         auVar18._0_8_ * auVar18._0_8_ + _ZN4idx2L17ExpChunkSizesStatE_4;
    sVar15 = plVar11[0xf];
    fwrite((void *)plVar11[0xc],sVar15,1,(FILE *)Fp);
    __size = (long)(((int)plVar11[5] + 7) / 8) + (plVar11[3] - *plVar11);
    fwrite((void *)*plVar11,__size,1,(FILE *)Fp);
    Var = (int)__size;
    WritePOD<int>(Fp,Var);
    local_88 = plVar11[9] << 3;
    auVar19._0_8_ = (double)local_88;
    auVar19._8_8_ = in_XMM4_Qb;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_0;
    auVar1 = vminsd_avx(auVar19,auVar9);
    _ZN4idx2L33UncompressedExpChunkAddressesStatE_0 = auVar1._0_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = _ZN4idx2L33UncompressedExpChunkAddressesStatE_1;
    auVar1 = vmaxsd_avx(auVar19,auVar3);
    _ZN4idx2L33UncompressedExpChunkAddressesStatE_1 = auVar1._0_8_;
    _ZN4idx2L33UncompressedExpChunkAddressesStatE_2 =
         auVar19._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_2;
    _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 =
         _ZN4idx2L33UncompressedExpChunkAddressesStatE_3 + 1;
    _ZN4idx2L33UncompressedExpChunkAddressesStatE_4 =
         auVar19._0_8_ * auVar19._0_8_ + _ZN4idx2L33UncompressedExpChunkAddressesStatE_4;
    local_90 = *(anon_union_8_2_2df48d06_for_stref_0 *)(plVar11 + 6);
    local_80 = plVar11[8];
    CompressBufZstd((buffer *)&local_90,local_78);
    pbVar14 = (E->CompressedChunkAddresses).Stream.Data;
    pbVar17 = (E->CompressedChunkAddresses).BitPtr +
              ((long)(((E->CompressedChunkAddresses).BitPos + 7) / 8) - (long)pbVar14);
    auVar20._0_8_ = (double)(long)pbVar17;
    auVar20._8_8_ = in_XMM4_Qb;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_0;
    auVar1 = vminsd_avx(auVar20,auVar4);
    _ZN4idx2L31CompressedExpChunkAddressesStatE_0 = auVar1._0_8_;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = _ZN4idx2L31CompressedExpChunkAddressesStatE_1;
    auVar1 = vmaxsd_avx(auVar20,auVar5);
    _ZN4idx2L31CompressedExpChunkAddressesStatE_1 = auVar1._0_8_;
    _ZN4idx2L31CompressedExpChunkAddressesStatE_2 =
         auVar20._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_2;
    _ZN4idx2L31CompressedExpChunkAddressesStatE_3 =
         _ZN4idx2L31CompressedExpChunkAddressesStatE_3 + 1;
    _ZN4idx2L31CompressedExpChunkAddressesStatE_4 =
         auVar20._0_8_ * auVar20._0_8_ + _ZN4idx2L31CompressedExpChunkAddressesStatE_4;
    fwrite(pbVar14,(size_t)pbVar17,1,(FILE *)Fp);
    WritePOD<int>(Fp,(int)pbVar17);
    WritePOD<int>(Fp,(int)plVar11[9]);
    WritePOD<int>(Fp,(int)pbVar17 + Var + (int)sVar15 + 0x10);
    plVar11 = local_b0;
    (**(code **)(*(long *)local_b0[0x11] + 8))((long *)local_b0[0x11],local_b0 + 0xc);
    plVar11[0xf] = 0;
    plVar11[0x10] = 0;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp:173:5)>
    ::~scope_guard(&__ScopeGuard__173);
    lVar13 = local_a0 * 8;
    lVar12 = local_a0 * 0x90;
    do {
      lVar16 = lVar12;
      lVar13 = lVar13 + 8;
      lVar10 = local_a0 + 1;
      local_a0 = local_a0 + 1;
      lVar12 = lVar16 + 0x90;
    } while (*(char *)(local_a8[2] + lVar10) != '\x02');
    local_b8 = (ulong *)(lVar13 + *local_a8);
    local_b0 = (long *)(local_a8[1] + 0x90 + lVar16);
  }
  *(char **)(*in_FS_OFFSET + -0xb80) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Write.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xcb;
  return (error<idx2::idx2_err_code>)ZEXT816(0x19942d);
}

Assistant:

error<idx2_err_code>
FlushChunkExponents(const idx2_file& Idx2, encode_data* E)
{
#if VISUS_IDX2
  if (Idx2.external_write)
  {
    Reserve(&E->SortedSubChannels, Size(E->SubChannels));
    Clear(&E->SortedSubChannels);
    idx2_ForEach (Sch, E->SubChannels)
    {
      sub_channel_info ScInfo;
      ScInfo.SubChannel = &*Sch;
      u64 Brick;
      i16 BitPlane;
      UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
      PushBack(&E->SortedSubChannels, ScInfo);
    }
    InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

    idx2_ForEach (Sch, E->SortedSubChannels)
      WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband); //just call  WriteChunkExponents

    return idx2_Error(idx2_err_code::NoError);
  }
#endif

  Reserve(&E->SortedSubChannels, Size(E->SubChannels));
  Clear(&E->SortedSubChannels);
  idx2_ForEach (Sch, E->SubChannels)
  {
    sub_channel_info ScInfo;
    ScInfo.SubChannel = &*Sch;
    u64 Brick;
    i16 BitPlane;
    UnpackFileAddress(Idx2, *Sch.Key, &Brick, &ScInfo.Level, &ScInfo.Subband, &BitPlane);
    PushBack(&E->SortedSubChannels, ScInfo);
  }
  InsertionSort(Begin(E->SortedSubChannels), End(E->SortedSubChannels));

  idx2_ForEach (Sch, E->SortedSubChannels)
    WriteChunkExponents(Idx2, E, Sch->SubChannel, Sch->Level, Sch->Subband);
  // TODO: deallocate the file emax buffer after it is flushed to a file
  // TODO: need to "interleave" this with FlushChunk
  // TODO: detect that we are done with a file to flush it as soon as possible instead of at the end (maybe count the number of chunks in a file)
  // TODO: as soon as we get out of a spatial domain for a file, flush every files in the buffer
  // (since we know that all files in the buffer cannot be traversed again in the spatial DFS order)
  idx2_ForEach (CeIt, E->ChunkExponents) // one CeIt for each file
  {
    chunk_exp_info* Ce = CeIt.Val;
    bitstream* ChunkExpSizes = &Ce->ExpSizes;
    file_id FileId = ConstructFilePath(Idx2, *CeIt.Key);
    idx2_Assert(FileId.Id == *CeIt.Key);
    /* write chunk emax sizes */
    idx2_OpenMaybeExistingFile(Fp, FileId.Name.ConstPtr, "ab");
    Flush(ChunkExpSizes);
    ExpChunkSizesStat.Add((f64)Size(*ChunkExpSizes));
    int TotalExpBytes = 0;
    // write the exponent buffer
    buffer Buf = ToBuffer(Ce->FileExpBuffer);
    WriteBuffer(Fp, Buf);
    TotalExpBytes += int(Buf.Bytes);
    // write the (compressed) sizes of the exponents
    Buf = ToBuffer(*ChunkExpSizes);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write compressed chunk addresses
    UncompressedExpChunkAddressesStat.Add((f64)Size(ToBuffer(Ce->Addrs)));
    CompressBufZstd(ToBuffer(Ce->Addrs), &E->CompressedChunkAddresses);
    CompressedExpChunkAddressesStat.Add((f64)Size(E->CompressedChunkAddresses));
    Buf = ToBuffer(E->CompressedChunkAddresses);
    WriteBuffer(Fp, Buf);
    WritePOD(Fp, (int)Buf.Bytes);
    TotalExpBytes += int(Buf.Bytes) + sizeof(int);
    // write number of chunks
    WritePOD(Fp, (int)Size(Ce->Addrs));
    TotalExpBytes += sizeof(int);
    // write the total number of bytes used for storing the exponents
    TotalExpBytes += sizeof(int);
    WritePOD(Fp, (int)TotalExpBytes);
    Dealloc(&CeIt.Val->FileExpBuffer);
  }

  return idx2_Error(idx2_err_code::NoError);
}